

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O1

_Bool do_cmd_walk_test(player *p,loc grid)

{
  short sVar1;
  _Bool _Var2;
  square *psVar3;
  monster *mon;
  char m_name [80];
  char acStack_78 [80];
  
  psVar3 = square(cave,grid);
  sVar1 = psVar3->mon;
  mon = cave_monster(cave,(int)sVar1);
  if ((0 < sVar1) && (_Var2 = monster_is_obvious(mon), _Var2)) {
    _Var2 = player_of_has(p,L'\x1c');
    if (!_Var2) {
      return true;
    }
    monster_desc(acStack_78,0x50,mon,L'\0');
    msgt(0x39,"You are too afraid to attack %s!",acStack_78);
    equip_learn_flag(p,L'\x1c');
    return false;
  }
  _Var2 = square_isknown(cave,grid);
  if (!_Var2) {
    return true;
  }
  _Var2 = square_ispassable(cave,grid);
  if (_Var2) {
    return true;
  }
  _Var2 = square_isrubble(cave,grid);
  if (_Var2) {
    msgt(0x10,"There is a pile of rubble in the way!");
    _Var2 = square_isrubble((chunk_conflict *)p->cave,grid);
    if (_Var2) goto LAB_0012e8bb;
    square_memorize(cave,grid);
  }
  else {
    _Var2 = square_iscloseddoor(cave,grid);
    if (_Var2) {
      return true;
    }
    msgt(0x10,"There is a wall in the way!");
    _Var2 = square_ispassable((chunk_conflict *)p->cave,grid);
    if (((!_Var2) && (_Var2 = square_isrubble((chunk_conflict *)p->cave,grid), !_Var2)) &&
       (_Var2 = square_iscloseddoor((chunk_conflict *)p->cave,grid), !_Var2)) goto LAB_0012e8bb;
    square_forget(cave,grid);
  }
  square_light_spot((chunk *)cave,grid);
LAB_0012e8bb:
  disturb(p);
  return false;
}

Assistant:

static bool do_cmd_walk_test(struct player *p, struct loc grid)
{
	int m_idx = square(cave, grid)->mon;
	struct monster *mon = cave_monster(cave, m_idx);

	/* Allow attack on obvious monsters if unafraid */
	if (m_idx > 0 && monster_is_obvious(mon)) {
		/* Handle player fear */
		if (player_of_has(p, OF_AFRAID)) {
			/* Extract monster name (or "it") */
			char m_name[80];
			monster_desc(m_name, sizeof(m_name), mon, MDESC_DEFAULT);

			/* Message */
			msgt(MSG_AFRAID, "You are too afraid to attack %s!", m_name);
			equip_learn_flag(p, OF_AFRAID);

			/* Nope */
			return (false);
		}

		return (true);
	}

	/* If we don't know the grid, allow attempts to walk into it */
	if (!square_isknown(cave, grid))
		return true;

	/*
	 * Require open space; if the messaging indicates what is there and
	 * that does not agree with the player's memory then update the
	 * player's memory
	 */
	if (!square_ispassable(cave, grid)) {
		if (square_isrubble(cave, grid)) {
			/* Rubble */
			msgt(MSG_HITWALL, "There is a pile of rubble in the way!");
			if (!square_isrubble(p->cave, grid)) {
				square_memorize(cave, grid);
				square_light_spot(cave, grid);
			}
		} else if (square_iscloseddoor(cave, grid)) {
			/* Door */
			return true;
		} else {
			/* Wall */
			msgt(MSG_HITWALL, "There is a wall in the way!");
			if (square_ispassable(p->cave, grid)
					|| square_isrubble(p->cave, grid)
					|| square_iscloseddoor(p->cave, grid)) {
				square_forget(cave, grid);
				square_light_spot(cave, grid);
			}
		}

		/* Cancel repeat */
		disturb(p);

		/* Nope */
		return (false);
	}

	/* Okay */
	return (true);
}